

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexpander.cpp
# Opt level: O2

void __thiscall PathExpander::addToPathlist(PathExpander *this,char *s)

{
  FString copy;
  FString FStack_18;
  
  FString::FString(&FStack_18,s);
  FixPathSeperator(&FStack_18);
  TArray<FString,_FString>::Push(&this->PathList,&FStack_18);
  FString::~FString(&FStack_18);
  return;
}

Assistant:

void PathExpander::addToPathlist(const char *s)
{
	FString copy = s;
	FixPathSeperator(copy);
	PathList.Push(copy);
}